

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  ImDrawListSplitter *pIVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  double dVar4;
  short sVar5;
  uint uVar6;
  ImGuiWindow *pIVar7;
  ImGuiTableTempData *pIVar8;
  ImGuiWindow *pIVar9;
  float *__src;
  void *pvVar10;
  ImGuiTableColumn *pIVar11;
  ImGuiContext *pIVar12;
  void *pvVar13;
  bool bVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ImU32 IVar18;
  ImGuiTableColumn *p;
  ImGuiTable *p_00;
  ImGuiTableTempData *__dest;
  float *__dest_00;
  void *ptr;
  ImGuiTableColumn *pIVar19;
  char *__dest_01;
  uint uVar20;
  long lVar21;
  ImRect *pIVar22;
  char *pcVar23;
  ulong uVar24;
  long lVar25;
  ImGuiTableColumn *pIVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  ImVec2 *pIVar30;
  ImGuiTableColumnFlags *pIVar31;
  ImVec2 *pIVar32;
  long lVar33;
  int iVar34;
  ulong uVar35;
  byte bVar36;
  ImVec2 IVar37;
  undefined8 extraout_XMM0_Qb;
  ImVec2 IVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar45 [16];
  ImGuiContext *g;
  ImRect outer_rect;
  ImGuiID local_11c;
  ImS16 local_100;
  ImRect local_e0;
  ImGuiTableTempData *local_d0;
  char *local_c8;
  ulong local_c0;
  ImVec2 *local_b8;
  ImGuiWindow *local_b0;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  ImDrawListSplitter local_98;
  undefined3 uStack_80;
  undefined5 uStack_7d;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined3 uStack_70;
  undefined5 uStack_6d;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar12 = GImGui;
  bVar36 = 0;
  pIVar7 = GImGui->CurrentWindow;
  pIVar7->WriteAccessed = true;
  if (pIVar7->SkipItems != false) {
    return false;
  }
  uVar24 = (ulong)(uint)columns_count;
  if (0x3f < columns_count - 1U) {
    __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0x13e,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  if ((((uint)flags >> 0x18 & 1) != 0) && (inner_width < 0.0)) {
    __assert_fail("inner_width >= 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0x140,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  IVar37 = GetContentRegionAvail();
  fVar41 = IVar37.y;
  auVar40._8_4_ = (int)extraout_XMM0_Qb;
  auVar40._0_4_ = IVar37.x;
  auVar40._4_4_ = IVar37.y;
  auVar40._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  if (IVar37.x <= 1.0) {
    auVar40._0_4_ = 0x3f800000;
  }
  if ((flags & 0x3000000U) == 0) {
    IVar37 = CalcItemSize(*outer_size,auVar40._0_4_,0.0);
    local_e0.Min = (pIVar7->DC).CursorPos;
    local_e0.Max.x = IVar37.x + local_e0.Min.x;
    local_e0.Max.y = IVar37.y + local_e0.Min.y;
  }
  else {
    if (fVar41 <= 1.0) {
      fVar41 = 1.0;
    }
    IVar37 = CalcItemSize(*outer_size,auVar40._0_4_,fVar41);
    local_e0.Min = (pIVar7->DC).CursorPos;
    local_e0.Max.x = IVar37.x + local_e0.Min.x;
    local_e0.Max.y = IVar37.y + local_e0.Min.y;
    bVar14 = IsClippedEx(&local_e0,0);
    if (bVar14) {
      ItemSize(&local_e0,-1.0);
      return false;
    }
  }
  local_b8 = outer_size;
  local_b0 = pIVar7;
  p_00 = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar12->Tables,id);
  local_c8 = name;
  local_c0 = (ulong)id;
  if (p_00->LastFrameActive == pIVar12->FrameCount) {
    sVar5 = p_00->InstanceCurrent;
    local_100 = sVar5 + 1;
    local_11c = (int)sVar5 + id + 1;
    uVar6 = p_00->Flags;
    if ((-1 < sVar5) && (p_00->ColumnsCount != columns_count)) {
      __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                    ,0x153,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
  }
  else {
    uVar6 = p_00->Flags;
    local_100 = 0;
    local_11c = id;
  }
  uVar15 = ImPool<ImGuiTable>::GetIndex(&pIVar12->Tables,p_00);
  pIVar7 = local_b0;
  iVar34 = pIVar12->TablesTempDataStacked;
  uVar35 = (long)iVar34 + 1;
  iVar29 = (int)uVar35;
  pIVar12->TablesTempDataStacked = iVar29;
  iVar28 = (pIVar12->TablesTempData).Size;
  if (iVar28 <= iVar34) {
    uStack_a0 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6d = 0;
    local_98._Channels.Data = (ImDrawChannel *)0x0;
    uStack_80 = 0;
    uStack_7d = 0;
    local_98._Current = 0;
    local_98._Count = 0;
    local_98._Channels.Size = 0;
    local_98._Channels.Capacity = 0;
    local_a8.x = 0.0;
    local_a8.y = -1.0;
    iVar27 = (pIVar12->TablesTempData).Capacity;
    if (iVar27 <= iVar34) {
      if (iVar27 == 0) {
        iVar27 = 8;
      }
      else {
        iVar27 = iVar27 / 2 + iVar27;
      }
      if (iVar27 <= iVar29) {
        iVar27 = iVar29;
      }
      __dest = (ImGuiTableTempData *)MemAlloc((long)iVar27 * 0x70);
      pIVar8 = (pIVar12->TablesTempData).Data;
      if (pIVar8 != (ImGuiTableTempData *)0x0) {
        local_d0 = __dest;
        memcpy(__dest,pIVar8,(long)(pIVar12->TablesTempData).Size * 0x70);
        MemFree((pIVar12->TablesTempData).Data);
        __dest = local_d0;
      }
      (pIVar12->TablesTempData).Data = __dest;
      (pIVar12->TablesTempData).Capacity = iVar27;
      iVar28 = (pIVar12->TablesTempData).Size;
    }
    if (iVar28 <= iVar34) {
      lVar25 = uVar35 - (long)iVar28;
      lVar33 = (long)iVar28 * 0x70;
      do {
        pIVar30 = &local_a8;
        pIVar32 = (ImVec2 *)((long)&((pIVar12->TablesTempData).Data)->TableIndex + lVar33);
        for (lVar21 = 0xe; lVar21 != 0; lVar21 = lVar21 + -1) {
          *pIVar32 = *pIVar30;
          pIVar30 = pIVar30 + (ulong)bVar36 * -2 + 1;
          pIVar32 = pIVar32 + (ulong)bVar36 * -2 + 1;
        }
        lVar33 = lVar33 + 0x70;
        lVar25 = lVar25 + -1;
      } while (lVar25 != 0);
    }
    (pIVar12->TablesTempData).Size = iVar29;
    ImDrawListSplitter::ClearFreeMemory(&local_98);
    if (local_98._Channels.Data != (ImDrawChannel *)0x0) {
      MemFree(local_98._Channels.Data);
    }
    uVar35 = (ulong)(uint)pIVar12->TablesTempDataStacked;
    iVar28 = (pIVar12->TablesTempData).Size;
  }
  if (((int)uVar35 < 1) || (iVar28 < (int)uVar35)) {
    pcVar23 = "T &ImVector<ImGuiTableTempData>::operator[](int) [T = ImGuiTableTempData]";
    goto LAB_00162563;
  }
  pIVar8 = (pIVar12->TablesTempData).Data;
  uVar35 = uVar35 & 0xffffffff;
  p_00->TempData = pIVar8 + (uVar35 - 1);
  pIVar8[uVar35 - 1].TableIndex = uVar15;
  pIVar1 = &pIVar8[uVar35 - 1].DrawSplitter;
  p_00->DrawSplitter = pIVar1;
  pIVar1->_Current = 0;
  pIVar1->_Count = 1;
  uVar16 = flags & 0xe000;
  p_00->IsDefaultSizingPolicy = uVar16 == 0;
  uVar20 = flags;
  if (uVar16 == 0) {
    uVar16 = 0x2000;
    if ((((uint)flags >> 0x18 & 1) == 0) && (uVar16 = 0x2000, (pIVar7->Flags & 0x40) == 0)) {
      uVar16 = 0x8000;
    }
    uVar20 = uVar16 | flags;
  }
  uVar17 = uVar20 | 0x40000;
  if (uVar16 != 0x4000) {
    uVar17 = uVar20;
  }
  uVar20 = uVar17 & 0xfffcffff;
  if ((uVar17 & 0x3000000) == 0) {
    uVar20 = uVar17;
  }
  uVar16 = uVar20 & 0xfffff7ff;
  if ((uVar20 >> 0xc & 1) == 0) {
    uVar16 = uVar20;
  }
  uVar20 = (uVar17 & 1) << 9 | uVar16;
  uVar17 = uVar20 | 0x10;
  if ((uVar16 & 0xf) == 0) {
    uVar20 = uVar17;
  }
  if (((uint)pIVar7->RootWindow->Flags >> 8 & 1) != 0) {
    uVar20 = uVar17;
  }
  p_00->ID = (ImGuiID)local_c0;
  p_00->Flags = uVar20;
  p_00->InstanceCurrent = local_100;
  p_00->LastFrameActive = pIVar12->FrameCount;
  p_00->InnerWindow = pIVar7;
  p_00->OuterWindow = pIVar7;
  p_00->ColumnsCount = columns_count;
  p_00->IsLayoutLocked = false;
  p_00->InnerWidth = inner_width;
  pIVar8[uVar35 - 1].UserOuterSize = *local_b8;
  if ((flags & 0x3000000U) == 0) {
    (p_00->InnerRect).Min = local_e0.Min;
    (p_00->InnerRect).Max = local_e0.Max;
    (p_00->OuterRect).Min = local_e0.Min;
    (p_00->OuterRect).Max = local_e0.Max;
    (p_00->WorkRect).Min = local_e0.Min;
    (p_00->WorkRect).Max = local_e0.Max;
  }
  else {
    fVar41 = inner_width;
    if ((uVar20 & 0x1000000) == 0) {
      fVar41 = 3.4028235e+38;
    }
    fVar41 = (float)(~-(uint)(0.0 < inner_width) & 0x7f7fffff |
                    (uint)fVar41 & -(uint)(0.0 < inner_width));
    if (fVar41 != 3.4028235e+38 || (uVar20 & 0x3000000) == 0x1000000) {
      if ((uVar20 & 0x3000000) == 0x1000000) {
        local_a8.y = 1.1754944e-38;
      }
      else {
        local_a8.y = 0.0;
      }
      local_a8.x = (float)(-(uint)(fVar41 != 3.4028235e+38) & (uint)fVar41);
      SetNextWindowContentSize(&local_a8);
    }
    if ((uVar6 & 0x3000000) == 0) {
      local_a8.x = 0.0;
      local_a8.y = 0.0;
      SetNextWindowScroll(&local_a8);
    }
    local_a8.x = local_e0.Max.x - local_e0.Min.x;
    local_a8.y = local_e0.Max.y - local_e0.Min.y;
    BeginChildEx(local_c8,local_11c,&local_a8,false,(uVar20 & 0x1000000) >> 0xd);
    pIVar9 = pIVar12->CurrentWindow;
    p_00->InnerWindow = pIVar9;
    IVar37 = (pIVar9->WorkRect).Max;
    (p_00->WorkRect).Min = (pIVar9->WorkRect).Min;
    (p_00->WorkRect).Max = IVar37;
    IVar37 = pIVar9->Pos;
    IVar38.x = (pIVar9->Size).x + IVar37.x;
    IVar38.y = (pIVar9->Size).y + IVar37.y;
    (p_00->OuterRect).Min = IVar37;
    (p_00->OuterRect).Max = IVar38;
    IVar37 = (pIVar9->InnerRect).Max;
    (p_00->InnerRect).Min = (pIVar9->InnerRect).Min;
    (p_00->InnerRect).Max = IVar37;
    if (((((pIVar9->WindowPadding).x != 0.0) || (fVar41 = (pIVar9->WindowPadding).y, fVar41 != 0.0))
        || (NAN(fVar41))) || ((pIVar9->WindowBorderSize != 0.0 || (NAN(pIVar9->WindowBorderSize)))))
    {
      __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                    ,0x18b,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
  }
  PushOverrideID(local_11c);
  pIVar9 = p_00->InnerWindow;
  p_00->HostIndentX = (pIVar9->DC).Indent.x;
  IVar37 = (pIVar9->ClipRect).Max;
  (p_00->HostClipRect).Min = (pIVar9->ClipRect).Min;
  (p_00->HostClipRect).Max = IVar37;
  p_00->HostSkipItems = pIVar9->SkipItems;
  IVar37 = (pIVar9->WorkRect).Max;
  pIVar8[uVar35 - 1].HostBackupWorkRect.Min = (pIVar9->WorkRect).Min;
  pIVar8[uVar35 - 1].HostBackupWorkRect.Max = IVar37;
  IVar37 = (pIVar9->ParentWorkRect).Max;
  pIVar8[uVar35 - 1].HostBackupParentWorkRect.Min = (pIVar9->ParentWorkRect).Min;
  pIVar8[uVar35 - 1].HostBackupParentWorkRect.Max = IVar37;
  pIVar8[uVar35 - 1].HostBackupColumnsOffset.x = (pIVar7->DC).ColumnsOffset.x;
  pIVar8[uVar35 - 1].HostBackupPrevLineSize = (pIVar9->DC).PrevLineSize;
  pIVar8[uVar35 - 1].HostBackupCurrLineSize = (pIVar9->DC).CurrLineSize;
  pIVar8[uVar35 - 1].HostBackupCursorMaxPos = (pIVar9->DC).CursorMaxPos;
  pIVar8[uVar35 - 1].HostBackupItemWidth = (pIVar7->DC).ItemWidth;
  pIVar8[uVar35 - 1].HostBackupItemWidthStackSize = (pIVar7->DC).ItemWidthStack.Size;
  fVar41 = 0.0;
  fVar43 = 0.0;
  if ((uVar20 >> 9 & 1) != 0) {
    fVar43 = 1.0;
  }
  (pIVar9->DC).CurrLineSize.x = 0.0;
  (pIVar9->DC).CurrLineSize.y = 0.0;
  (pIVar9->DC).PrevLineSize.x = 0.0;
  (pIVar9->DC).PrevLineSize.y = 0.0;
  if ((uVar20 & 0x800200) == 0x200) {
    fVar41 = (pIVar12->Style).CellPadding.x;
LAB_00161e8e:
    fVar42 = 0.0;
  }
  else {
    if ((uVar20 & 0x800200) != 0) goto LAB_00161e8e;
    fVar42 = (pIVar12->Style).CellPadding.x;
  }
  p_00->CellSpacingX1 = fVar43 + fVar42;
  p_00->CellSpacingX2 = fVar42;
  p_00->CellPaddingX = fVar41;
  p_00->CellPaddingY = (pIVar12->Style).CellPadding.y;
  fVar43 = 0.0;
  fVar42 = 0.0;
  if ((uVar20 >> 10 & 1) != 0) {
    fVar42 = 1.0;
  }
  if ((uVar20 >> 0x16 & 1) == 0 && (uVar20 & 0x200400) != 0) {
    fVar43 = (pIVar12->Style).CellPadding.x;
  }
  p_00->OuterPaddingX = (fVar42 + fVar43) - fVar41;
  p_00->CurrentRow = -1;
  p_00->CurrentColumn = -1;
  p_00->RowBgColorCounter = 0;
  *(uint *)&p_00->field_0x98 = (uint)*(ushort *)&p_00->field_0x98;
  pIVar22 = &pIVar9->ClipRect;
  if (pIVar9 == pIVar7) {
    pIVar22 = &p_00->WorkRect;
  }
  IVar37 = pIVar22->Max;
  (p_00->InnerClipRect).Min = pIVar22->Min;
  (p_00->InnerClipRect).Max = IVar37;
  IVar37 = (p_00->InnerClipRect).Min;
  auVar39._8_8_ = 0;
  auVar39._0_4_ = (p_00->InnerClipRect).Max.x;
  auVar39._4_4_ = (p_00->InnerClipRect).Max.y;
  IVar38 = (p_00->WorkRect).Min;
  fVar42 = IVar38.x;
  fVar44 = IVar38.y;
  auVar45._8_8_ = 0;
  auVar45._0_4_ = (p_00->WorkRect).Max.x;
  auVar45._4_4_ = (p_00->WorkRect).Max.y;
  auVar40 = minps(auVar39,auVar45);
  fVar41 = IVar37.x;
  fVar43 = IVar37.y;
  uVar16 = -(uint)(fVar42 <= fVar41);
  uVar17 = -(uint)(fVar44 <= fVar43);
  (p_00->InnerClipRect).Min =
       (ImVec2)(CONCAT44(~uVar17 & (uint)fVar44,~uVar16 & (uint)fVar42) |
               CONCAT44((uint)fVar43 & uVar17,(uint)fVar41 & uVar16));
  (p_00->InnerClipRect).Max = auVar40._0_8_;
  ImRect::ClipWithFull(&p_00->InnerClipRect,&p_00->HostClipRect);
  if ((uVar20 >> 0x11 & 1) == 0) {
    fVar41 = (pIVar9->ClipRect).Max.y;
  }
  else {
    fVar41 = (p_00->InnerClipRect).Max.y;
    fVar43 = (pIVar9->WorkRect).Max.y;
    if (fVar43 <= fVar41) {
      fVar41 = fVar43;
    }
  }
  (p_00->InnerClipRect).Max.y = fVar41;
  fVar41 = (p_00->WorkRect).Min.y;
  p_00->RowPosY2 = fVar41;
  p_00->RowPosY1 = fVar41;
  p_00->RowTextBaseline = 0.0;
  p_00->FreezeRowsRequest = '\0';
  p_00->FreezeRowsCount = '\0';
  p_00->FreezeColumnsRequest = '\0';
  p_00->FreezeColumnsCount = '\0';
  p_00->IsUnfrozenRows = true;
  p_00->DeclColumnsCount = '\0';
  IVar18 = GetColorU32(0x2d,1.0);
  p_00->BorderColorStrong = IVar18;
  IVar18 = GetColorU32(0x2e,1.0);
  p_00->BorderColorLight = IVar18;
  pIVar12->CurrentTable = p_00;
  (pIVar7->DC).CurrentTableIdx = uVar15;
  if (pIVar9 != pIVar7) {
    (pIVar9->DC).CurrentTableIdx = uVar15;
  }
  if (((uVar6 & 2) != 0) && ((uVar20 & 2) == 0)) {
    p_00->IsResetDisplayOrderRequest = true;
  }
  iVar34 = (pIVar12->TablesLastTimeActive).Size;
  if (iVar34 <= (int)uVar15) {
    iVar29 = uVar15 + 1;
    iVar28 = (pIVar12->TablesLastTimeActive).Capacity;
    if (iVar28 <= (int)uVar15) {
      if (iVar28 == 0) {
        iVar28 = 8;
      }
      else {
        iVar28 = iVar28 / 2 + iVar28;
      }
      if (iVar28 <= iVar29) {
        iVar28 = iVar29;
      }
      __dest_00 = (float *)MemAlloc((long)iVar28 << 2);
      __src = (pIVar12->TablesLastTimeActive).Data;
      if (__src != (float *)0x0) {
        memcpy(__dest_00,__src,(long)(pIVar12->TablesLastTimeActive).Size << 2);
        MemFree((pIVar12->TablesLastTimeActive).Data);
      }
      (pIVar12->TablesLastTimeActive).Data = __dest_00;
      (pIVar12->TablesLastTimeActive).Capacity = iVar28;
      iVar34 = (pIVar12->TablesLastTimeActive).Size;
    }
    if (iVar34 <= (int)uVar15) {
      lVar25 = (long)iVar34;
      do {
        (pIVar12->TablesLastTimeActive).Data[lVar25] = -1.0;
        lVar25 = lVar25 + 1;
      } while (iVar29 != lVar25);
    }
    (pIVar12->TablesLastTimeActive).Size = iVar29;
    iVar34 = iVar29;
  }
  if (((int)uVar15 < 0) || (iVar34 <= (int)uVar15)) {
    pcVar23 = "T &ImVector<float>::operator[](int) [T = float]";
LAB_00162563:
    __assert_fail("i >= 0 && i < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                  ,0x706,pcVar23);
  }
  dVar4 = pIVar12->Time;
  (pIVar12->TablesLastTimeActive).Data[uVar15] = (float)dVar4;
  pIVar8[uVar35 - 1].LastTimeActive = (float)dVar4;
  p_00->MemoryCompacted = false;
  pvVar10 = p_00->RawData;
  pIVar19 = (p_00->Columns).Data;
  iVar34 = (int)((long)(p_00->Columns).DataEnd - (long)pIVar19 >> 3) * -0x3b13b13b;
  if (iVar34 == columns_count || iVar34 == 0) {
    pIVar19 = (ImGuiTableColumn *)0x0;
    ptr = (void *)0x0;
    pvVar13 = (void *)0x0;
    if (pvVar10 == (void *)0x0) goto LAB_001621bc;
  }
  else {
    p_00->RawData = (void *)0x0;
    pvVar13 = pvVar10;
LAB_001621bc:
    ptr = pvVar13;
    TableBeginInitMemory(p_00,columns_count);
    p_00->IsSettingsRequestLoad = true;
    p_00->IsInitializing = true;
  }
  if (p_00->IsResetAllRequest == true) {
    p_00->IsInitializing = true;
    p_00->IsResetAllRequest = false;
    p_00->IsSettingsRequestLoad = false;
    p_00->IsSettingsDirty = true;
    p_00->SettingsLoadedFlags = 0;
  }
  else if ((p_00->IsInitializing & 1U) == 0) goto LAB_00162392;
  p_00->SettingsOffset = -1;
  p_00->IsSortSpecsDirty = true;
  p_00->InstanceInteracted = -1;
  p_00->ContextPopupColumn = -1;
  p_00->ReorderColumn = -1;
  p_00->HoveredColumnBody = -1;
  p_00->HoveredColumnBorder = -1;
  p_00->AutoFitSingleColumn = -1;
  p_00->ResizedColumn = -1;
  p_00->LastResizedColumn = -1;
  if (0 < columns_count) {
    lVar25 = 0x61;
    uVar35 = 0;
    do {
      pIVar11 = (p_00->Columns).Data;
      pIVar26 = (ImGuiTableColumn *)((long)pIVar11 + lVar25 + -0x61);
      if ((p_00->Columns).DataEnd <= pIVar26) goto LAB_001624a4;
      if ((pIVar19 == (ImGuiTableColumn *)0x0) || ((long)iVar34 <= (long)uVar35)) {
        uVar3 = *(undefined4 *)((long)pIVar11 + lVar25 + -0x4d);
        local_78 = 0;
        local_98._Channels.Data = (ImDrawChannel *)0x0;
        uStack_80 = 0;
        uStack_7d = 0;
        local_98._Current = 0;
        local_98._Count = 0;
        local_98._Channels.Size = 0;
        local_98._Channels.Capacity = 0;
        local_a8.x = 0.0;
        local_a8.y = 0.0;
        uStack_a0 = 0;
        uStack_70 = 0xffffff;
        uStack_74 = 0xffffffff;
        pIVar26->Flags = 0;
        pIVar26->WidthGiven = 0.0;
        *(undefined8 *)((long)pIVar11 + lVar25 + -0x59) = 0;
        *(undefined4 *)((long)pIVar11 + lVar25 + -0x51) = 0xbf800000;
        *(undefined4 *)((long)pIVar11 + lVar25 + -0x49) = 0xbf800000;
        puVar2 = (undefined8 *)((long)pIVar11 + lVar25 + -0x45);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)pIVar11 + lVar25 + -0x35);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)pIVar11 + lVar25 + -0x25);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)pIVar11 + lVar25 + -0x1a);
        *puVar2 = 0;
        puVar2[1] = 0xffffffffffffff00;
        *(undefined4 *)((long)&pIVar11->Flags + lVar25 + 2) = 0;
        *(undefined8 *)((long)pIVar11 + lVar25 + -5) = 0;
        *(undefined4 *)((long)pIVar11 + lVar25 + -0x4d) = uVar3;
        *(undefined1 *)((long)&pIVar11->Flags + lVar25) = 1;
        *(undefined2 *)((long)pIVar11 + lVar25 + -6) = 0x101;
        *(undefined4 *)((long)pIVar11 + lVar25 + -10) = 0x1ffffff;
      }
      else {
        pIVar31 = (ImGuiTableColumnFlags *)((long)pIVar19 + lVar25 + -0x61);
        for (lVar33 = 0x19; lVar33 != 0; lVar33 = lVar33 + -1) {
          pIVar26->Flags = *pIVar31;
          pIVar31 = pIVar31 + (ulong)bVar36 * -2 + 1;
          pIVar26 = (ImGuiTableColumn *)((long)pIVar26 + (ulong)bVar36 * -8 + 4);
        }
        *(undefined1 *)((long)&pIVar11->WidthGiven + lVar25 + 1) =
             *(undefined1 *)((long)&pIVar19->WidthGiven + lVar25 + 1);
        *(undefined2 *)((long)&pIVar11->Flags + lVar25 + 3) =
             *(undefined2 *)((long)&pIVar19->Flags + lVar25 + 3);
      }
      pcVar23 = (p_00->DisplayOrderToIndex).Data + uVar35;
      if ((p_00->DisplayOrderToIndex).DataEnd <= pcVar23) {
        pcVar23 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
        goto LAB_001624d0;
      }
      *pcVar23 = (char)uVar35;
      *(char *)((long)pIVar11 + lVar25 + -0xf) = (char)uVar35;
      uVar35 = uVar35 + 1;
      lVar25 = lVar25 + 0x68;
    } while ((uint)columns_count != uVar35);
  }
LAB_00162392:
  if (ptr != (void *)0x0) {
    MemFree(ptr);
  }
  if (p_00->IsSettingsRequestLoad == true) {
    TableLoadSettings(p_00);
  }
  fVar41 = pIVar12->FontSize;
  fVar43 = p_00->RefScale;
  if ((fVar43 != 0.0) || (NAN(fVar43))) {
    if (((fVar43 != fVar41) || (NAN(fVar43) || NAN(fVar41))) && (0 < columns_count)) {
      pIVar19 = (p_00->Columns).Data;
      do {
        if ((p_00->Columns).DataEnd <= pIVar19) {
LAB_001624a4:
          pcVar23 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_001624d0:
          __assert_fail("p >= Data && p < DataEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_internal.h"
                        ,0x24a,pcVar23);
        }
        pIVar19->WidthRequest = pIVar19->WidthRequest * (fVar41 / fVar43);
        pIVar19 = pIVar19 + 1;
        uVar24 = uVar24 - 1;
      } while (uVar24 != 0);
    }
  }
  p_00->RefScale = fVar41;
  pIVar9->SkipItems = true;
  if (0 < (p_00->ColumnsNames).Buf.Size) {
    if ((p_00->ColumnsNames).Buf.Capacity < 0) {
      __dest_01 = (char *)MemAlloc(0);
      pcVar23 = (p_00->ColumnsNames).Buf.Data;
      if (pcVar23 != (char *)0x0) {
        memcpy(__dest_01,pcVar23,(long)(p_00->ColumnsNames).Buf.Size);
        MemFree((p_00->ColumnsNames).Buf.Data);
      }
      (p_00->ColumnsNames).Buf.Data = __dest_01;
      (p_00->ColumnsNames).Buf.Capacity = 0;
    }
    (p_00->ColumnsNames).Buf.Size = 0;
  }
  TableBeginApplyRequests(p_00);
  return true;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Acquire temporary buffers
    const int table_idx = g.Tables.GetIndex(table);
    if (++g.TablesTempDataStacked > g.TablesTempData.Size)
        g.TablesTempData.resize(g.TablesTempDataStacked, ImGuiTableTempData());
    ImGuiTableTempData* temp_data = table->TempData = &g.TablesTempData[g.TablesTempDataStacked - 1];
    temp_data->TableIndex = table_idx;
    table->DrawSplitter = &table->TempData->DrawSplitter;
    table->DrawSplitter->Clear();

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    temp_data->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    temp_data->HostBackupWorkRect = inner_window->WorkRect;
    temp_data->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    temp_data->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    temp_data->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    temp_data->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    temp_data->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    temp_data->HostBackupItemWidth = outer_window->DC.ItemWidth;
    temp_data->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    temp_data->LastTimeActive = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    ImGuiTableColumn* old_columns_to_preserve = NULL;
    void* old_columns_raw_data = NULL;
    const int old_columns_count = table->Columns.size();
    if (old_columns_count != 0 && old_columns_count != columns_count)
    {
        // Attempt to preserve width on column count change (#4046)
        old_columns_to_preserve = table->Columns.Data;
        old_columns_raw_data = table->RawData;
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            if (old_columns_to_preserve && n < old_columns_count)
            {
                // FIXME: We don't attempt to preserve column order in this path.
                *column = old_columns_to_preserve[n];
            }
            else
            {
                float width_auto = column->WidthAuto;
                *column = ImGuiTableColumn();
                column->WidthAuto = width_auto;
                column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
                column->IsEnabled = column->IsUserEnabled = column->IsUserEnabledNextFrame = true;
            }
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
        }
    }
    if (old_columns_raw_data)
        IM_FREE(old_columns_raw_data);

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}